

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>
wabt::MakeUnique<wabt::FuncType>(void)

{
  FuncType *this;
  __uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true> in_RDI;
  string_view local_20;
  
  this = (FuncType *)operator_new(0x80);
  string_view::string_view(&local_20);
  FuncType::FuncType(this,local_20);
  std::unique_ptr<wabt::FuncType,std::default_delete<wabt::FuncType>>::
  unique_ptr<std::default_delete<wabt::FuncType>,void>
            ((unique_ptr<wabt::FuncType,std::default_delete<wabt::FuncType>> *)
             in_RDI.super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t
             .super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
             super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)
         (tuple<wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>)
         in_RDI.super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
         super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}